

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QModelIndex * __thiscall
QTreeViewPrivate::modelIndex
          (QModelIndex *__return_storage_ptr__,QTreeViewPrivate *this,int i,int column)

{
  QTreeViewItem *pQVar1;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  int iVar4;
  undefined4 uVar5;
  quintptr qVar6;
  long in_FS_OFFSET;
  undefined8 local_28;
  quintptr qStack_20;
  QAbstractItemModel *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((i < 0) || (uVar3 = (ulong)(uint)i, (ulong)(this->viewItems).d.size <= uVar3)) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_005affc6;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->viewItems).d.ptr;
    (__return_storage_ptr__->m).ptr = pQVar1[uVar3].index.m.ptr;
    pQVar1 = pQVar1 + uVar3;
    iVar4 = (pQVar1->index).c;
    qVar6 = (pQVar1->index).i;
    uVar5 = *(undefined4 *)((long)&(pQVar1->index).i + 4);
    __return_storage_ptr__->r = (pQVar1->index).r;
    __return_storage_ptr__->c = iVar4;
    *(int *)&__return_storage_ptr__->i = (int)qVar6;
    *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar5;
    if (column != 0) {
      pQVar2 = (__return_storage_ptr__->m).ptr;
      if (pQVar2 == (QAbstractItemModel *)0x0) {
        local_28 = 0xffffffffffffffff;
        qStack_20 = 0;
        local_18 = (QAbstractItemModel *)0x0;
      }
      else if (__return_storage_ptr__->c == column) {
        local_18 = (__return_storage_ptr__->m).ptr;
        local_28._0_4_ = __return_storage_ptr__->r;
        local_28._4_4_ = __return_storage_ptr__->c;
        qStack_20 = __return_storage_ptr__->i;
      }
      else {
        (**(code **)(*(long *)pQVar2 + 0x70))
                  (&local_28,pQVar2,__return_storage_ptr__->r,column,__return_storage_ptr__);
      }
      (__return_storage_ptr__->m).ptr = local_18;
      __return_storage_ptr__->r = (undefined4)local_28;
      __return_storage_ptr__->c = local_28._4_4_;
      __return_storage_ptr__->i = qStack_20;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_005affc6:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTreeViewPrivate::modelIndex(int i, int column) const
{
    if (i < 0 || i >= viewItems.size())
        return QModelIndex();

    QModelIndex ret = viewItems.at(i).index;
    if (column)
        ret = ret.sibling(ret.row(), column);
    return ret;
}